

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O0

void helics::valueExtract
               (data_view *data,DataType baseType,
               vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *val)

{
  string_view val_00;
  uint uVar1;
  long lVar2;
  size_type sVar3;
  double *in_RDX;
  undefined4 in_ESI;
  complex<double> cval;
  NamedPoint npval;
  size_t ii;
  vector<double,_std::allocator<double>_> vec;
  Time time;
  undefined4 in_stack_00000178;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_stack_000001b0;
  undefined1 in_stack_000001b8 [16];
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  time_units in_stack_fffffffffffffe84;
  undefined4 uVar4;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_stack_fffffffffffffe88;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe90;
  data_view *in_stack_fffffffffffffe98;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_stack_fffffffffffffea0;
  size_t in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_stack_ffffffffffffff38;
  defV *in_stack_ffffffffffffff40;
  double local_a0;
  ulong local_80;
  vector<double,_std::allocator<double>_> local_78;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  undefined8 local_50;
  double local_48;
  undefined8 local_38;
  double local_30;
  undefined8 local_28;
  double local_20;
  double *local_18;
  undefined4 local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
            (in_stack_fffffffffffffea0,(size_type)in_stack_fffffffffffffe98);
  switch(local_c) {
  case 0:
  case 9:
  default:
    local_60 = ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::interpret
                         ((data_view *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80)
                         );
    helicsGetComplexVector((string_view)in_stack_000001b8,in_stack_000001b0);
    break;
  case 1:
    local_20 = ValueConverter<double>::interpret
                         ((data_view *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80)
                         );
    local_28 = 0;
    std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
    emplace_back<double,double>
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
               in_stack_fffffffffffffe90,(double *)in_stack_fffffffffffffe88,
               (double *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    break;
  case 2:
    lVar2 = ValueConverter<long>::interpret
                      ((data_view *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    local_30 = (double)lVar2;
    local_38 = 0;
    std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
    emplace_back<double,double>
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
               in_stack_fffffffffffffe90,(double *)in_stack_fffffffffffffe88,
               (double *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    break;
  case 3:
    ValueConverter<std::complex<double>_>::interpret
              ((data_view *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::push_back
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
               in_stack_fffffffffffffe90,(value_type *)in_stack_fffffffffffffe88);
    break;
  case 4:
    ValueConverter<std::vector<double,_std::allocator<double>_>_>::interpret
              (in_stack_fffffffffffffe98);
    for (local_80 = 0; sVar3 = CLI::std::vector<double,_std::allocator<double>_>::size(&local_78),
        local_80 < sVar3 - 1; local_80 = local_80 + 2) {
      in_stack_fffffffffffffe90 = (vector<double,_std::allocator<double>_> *)&local_78;
      std::vector<double,_std::allocator<double>_>::operator[](in_stack_fffffffffffffe90,local_80);
      std::vector<double,_std::allocator<double>_>::operator[]
                (in_stack_fffffffffffffe90,local_80 + 1);
      std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
      emplace_back<double&,double&>
                ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                 in_stack_fffffffffffffe90,(double *)in_stack_fffffffffffffe88,
                 (double *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    }
    sVar3 = CLI::std::vector<double,_std::allocator<double>_>::size(&local_78);
    if ((sVar3 & 1) == 1) {
      std::vector<double,_std::allocator<double>_>::back
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
      emplace_back<double&,double>
                ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                 in_stack_fffffffffffffe90,local_18,
                 (double *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    }
    CLI::std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe90);
    break;
  case 5:
    ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
    interpret((data_view *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
              in_stack_fffffffffffffe78);
    break;
  case 6:
    ValueConverter<helics::NamedPoint>::interpret(in_stack_fffffffffffffe98);
    uVar1 = std::isnan(local_a0);
    uVar4 = CONCAT13((char)uVar1,(int3)in_stack_fffffffffffffe84);
    if ((uVar1 & 1) == 0) {
      std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
      emplace_back<double&,double>
                ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                 in_stack_fffffffffffffe90,(double *)in_stack_fffffffffffffe88,
                 (double *)CONCAT44(uVar4,in_stack_fffffffffffffe80));
    }
    else {
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uVar4,in_stack_fffffffffffffe80));
      val_00._M_str = in_stack_fffffffffffffeb8;
      val_00._M_len = in_stack_fffffffffffffeb0;
      helicsGetComplexVector(val_00);
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
                ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                 in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      CLI::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
                ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                 in_stack_fffffffffffffe90);
    }
    NamedPoint::~NamedPoint((NamedPoint *)0x2b7f8a);
    break;
  case 8:
    ValueConverter<long>::interpret
              ((data_view *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
              ((TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffffe90,
               (int64_t)in_stack_fffffffffffffe88,in_stack_fffffffffffffe84);
    local_48 = TimeRepresentation::operator_cast_to_double
                         ((TimeRepresentation<count_time<9,_long>_> *)0x2b7cb7);
    local_50 = 0;
    std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
    emplace_back<double,double>
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
               in_stack_fffffffffffffe90,(double *)in_stack_fffffffffffffe88,
               (double *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    break;
  case 0x1e:
    readJsonValue_abi_cxx11_((data_view *)CONCAT44(baseType,in_stack_00000178));
    valueExtract(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    CLI::std::
    variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
    ::~variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x2b7ff8);
  }
  return;
}

Assistant:

void valueExtract(const data_view& data, DataType baseType, std::vector<std::complex<double>>& val)
{
    val.resize(0);
    switch (baseType) {
        case DataType::HELICS_DOUBLE: {
            val.emplace_back(ValueConverter<double>::interpret(data), 0.0);
            break;
        }
        case DataType::HELICS_INT: {
            val.emplace_back(static_cast<double>(ValueConverter<int64_t>::interpret(data)), 0.0);
            break;
        }
        case DataType::HELICS_TIME: {
            const Time time(ValueConverter<int64_t>::interpret(data), time_units::ns);
            val.emplace_back(static_cast<double>(time), 0.0);
        } break;
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
        default: {
            helicsGetComplexVector(ValueConverter<std::string_view>::interpret(data), val);
            break;
        }
        case DataType::HELICS_VECTOR: {
            auto vec = ValueConverter<std::vector<double>>::interpret(data);
            for (size_t ii = 0; ii < vec.size() - 1; ii += 2) {
                val.emplace_back(vec[ii], vec[ii + 1]);
            }
            if (vec.size() % 2 == 1) {
                val.emplace_back(vec.back(), 0.0);
            }

            break;
        }
        case DataType::HELICS_COMPLEX_VECTOR: {
            ValueConverter<std::vector<std::complex<double>>>::interpret(data, val);
            break;
        }
        case DataType::HELICS_NAMED_POINT: {
            auto npval = ValueConverter<NamedPoint>::interpret(data);
            if (std::isnan(npval.value)) {
                val = helicsGetComplexVector(npval.name);
            } else {
                val.emplace_back(npval.value, 0.0);
            }
            break;
        }
        case DataType::HELICS_COMPLEX: {
            auto cval = ValueConverter<std::complex<double>>::interpret(data);
            val.push_back(cval);
            break;
        }
        case DataType::HELICS_JSON:
            valueExtract(readJsonValue(data), val);
            break;
    }
}